

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O3

bool __thiscall
cmBinUtilsMacOSMachOLinker::GetFileDependencies
          (cmBinUtilsMacOSMachOLinker *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths)

{
  cmRuntimeDependencyArchive *pcVar1;
  bool bVar2;
  int iVar3;
  FileInfo *libs;
  string *name;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  bool unique;
  bool resolved;
  string path;
  string filename;
  bool local_aa;
  bool local_a9;
  string local_a8;
  string local_88;
  string *local_68;
  string *local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_58;
  string *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  name = (names->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  local_50 = (names->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (name != local_50) {
    local_68 = executablePath;
    local_60 = loaderPath;
    local_58 = rpaths;
    do {
      bVar2 = cmRuntimeDependencyArchive::IsPreExcluded((this->super_cmBinUtilsLinker).Archive,name)
      ;
      if (!bVar2) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        local_a8._M_string_length = 0;
        local_a8.field_2._M_local_buf[0] = '\0';
        bVar2 = ResolveDependency(this,name,local_68,local_60,local_58,&local_a8,&local_a9);
        if (!bVar2) goto LAB_004b355c;
        pcVar1 = (this->super_cmBinUtilsLinker).Archive;
        if (local_a9 == true) {
          bVar2 = cmRuntimeDependencyArchive::IsPostExcluded(pcVar1,&local_a8);
          if (!bVar2) {
            local_88._M_dataplus._M_p = (pointer)local_a8._M_string_length;
            local_88._M_string_length = (size_type)local_a8._M_dataplus._M_p;
            __str._M_str = "/System/Library/";
            __str._M_len = 0x10;
            iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)&local_88,0,0x10,
                               __str);
            if (iVar3 == 0) {
LAB_004b3456:
              bVar2 = cmsys::SystemTools::PathExists(&local_a8);
              if (!bVar2) goto LAB_004b3511;
            }
            else {
              local_88._M_dataplus._M_p = (pointer)local_a8._M_string_length;
              local_88._M_string_length = (size_type)local_a8._M_dataplus._M_p;
              __str_00._M_str = "/usr/lib/";
              __str_00._M_len = 9;
              iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                                ((basic_string_view<char,_std::char_traits<char>_> *)&local_88,0,9,
                                 __str_00);
              if (iVar3 == 0) goto LAB_004b3456;
            }
            cmsys::SystemTools::GetFilenameName(&local_88,&local_a8);
            libs = GetFileInfo(this,&local_a8);
            if (libs != (FileInfo *)0x0) {
              pcVar1 = (this->super_cmBinUtilsLinker).Archive;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_48,&libs->rpaths);
              cmRuntimeDependencyArchive::AddResolvedPath
                        (pcVar1,&local_88,&local_a8,&local_aa,&local_48);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_48);
              if ((local_aa != true) ||
                 (bVar2 = ScanDependencies(this,&local_a8,&libs->libs,&libs->rpaths,local_68), bVar2
                 )) {
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p,
                                  local_88.field_2._M_allocated_capacity + 1);
                }
                goto LAB_004b3511;
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
            }
LAB_004b355c:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
              operator_delete(local_a8._M_dataplus._M_p,
                              CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                       local_a8.field_2._M_local_buf[0]) + 1);
            }
            return false;
          }
        }
        else {
          cmRuntimeDependencyArchive::AddUnresolvedPath(pcVar1,name);
        }
LAB_004b3511:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
      }
      name = name + 1;
    } while (name != local_50);
  }
  return true;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::GetFileDependencies(
  std::vector<std::string> const& names, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths)
{
  for (std::string const& name : names) {
    if (!this->Archive->IsPreExcluded(name)) {
      std::string path;
      bool resolved;
      if (!this->ResolveDependency(name, executablePath, loaderPath, rpaths,
                                   path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path) &&
            !IsMissingSystemDylib(path)) {
          auto filename = cmSystemTools::GetFilenameName(path);
          bool unique;
          const FileInfo* dep_file_info = this->GetFileInfo(path);
          if (dep_file_info == nullptr) {
            return false;
          }

          this->Archive->AddResolvedPath(filename, path, unique,
                                         dep_file_info->rpaths);
          if (unique &&
              !this->ScanDependencies(path, dep_file_info->libs,
                                      dep_file_info->rpaths, executablePath)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(name);
      }
    }
  }

  return true;
}